

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.h
# Opt level: O2

bool __thiscall cmWorkerPool::EmplaceJob<cmQtAutoMocUic::JobFinishT>(cmWorkerPool *this)

{
  bool bVar1;
  _Head_base<0UL,_cmWorkerPool::JobT_*,_false> local_20;
  JobT *local_18;
  
  std::make_unique<cmQtAutoMocUic::JobFinishT>();
  local_20._M_head_impl = local_18;
  local_18 = (JobT *)0x0;
  bVar1 = PushJob(this,(JobHandleT *)&local_20);
  if (local_20._M_head_impl != (JobT *)0x0) {
    (*(local_20._M_head_impl)->_vptr_JobT[1])();
  }
  local_20._M_head_impl = (JobT *)0x0;
  if (local_18 != (JobT *)0x0) {
    (**(code **)(*(long *)local_18 + 8))();
  }
  return bVar1;
}

Assistant:

bool EmplaceJob(Args&&... args)
  {
    return PushJob(cm::make_unique<T>(std::forward<Args>(args)...));
  }